

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkComponentSwizzle
Diligent::TextureComponentSwizzleToVkComponentSwizzle(TEXTURE_COMPONENT_SWIZZLE Swizzle)

{
  TEXTURE_COMPONENT_SWIZZLE Swizzle_local;
  
  return (VkComponentSwizzle)Swizzle;
}

Assistant:

VkComponentSwizzle TextureComponentSwizzleToVkComponentSwizzle(TEXTURE_COMPONENT_SWIZZLE Swizzle)
{
    static_assert(TEXTURE_COMPONENT_SWIZZLE_COUNT == 7, "Did you add a new swizzle type? Please handle it here.");
    // clang-format off
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_IDENTITY) == VK_COMPONENT_SWIZZLE_IDENTITY, "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_IDENTITY enum.");
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_ZERO)     == VK_COMPONENT_SWIZZLE_ZERO,     "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_ZERO enum.");
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_ONE)      == VK_COMPONENT_SWIZZLE_ONE,      "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_ONE enum.");
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_R)        == VK_COMPONENT_SWIZZLE_R,        "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_R enum.");
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_G)        == VK_COMPONENT_SWIZZLE_G,        "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_G enum.");
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_B)        == VK_COMPONENT_SWIZZLE_B,        "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_B enum.");
    static_assert(static_cast<VkComponentSwizzle>(TEXTURE_COMPONENT_SWIZZLE_A)        == VK_COMPONENT_SWIZZLE_A,        "Unexpected value of TEXTURE_COMPONENT_SWIZZLE_A enum.");
    // clang-format on
    return static_cast<VkComponentSwizzle>(Swizzle);
}